

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCall.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::FunctionCall::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionCall *this,int level)

{
  pointer puVar1;
  FunctionCallArgument *pFVar2;
  long lVar3;
  string *psVar4;
  ostream *poVar5;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  *argument;
  pointer puVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  long local_1e8;
  string *local_1e0;
  string local_1d8 [32];
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_228,(char)level);
  std::operator+(&local_208,&local_228,"FunctionCall ");
  poVar5 = std::operator<<(local_1a8,(string *)&local_208);
  poVar5 = std::operator<<(poVar5,(string *)&this->name);
  poVar5 = std::operator<<(poVar5," {");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  local_1e8 = (long)level;
  local_1e0 = __return_storage_ptr__;
  if (this->late_call != false) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_228,(char)level + '\x01');
    std::operator+(&local_208,&local_228,"LATE CALL");
    poVar5 = std::operator<<(local_1a8,(string *)&local_208);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
  }
  iVar7 = level + 1;
  puVar1 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->arguments).
                super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 = local_1e0, lVar3 = local_1e8,
      puVar6 != puVar1; puVar6 = puVar6 + 1) {
    pFVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl;
    (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x18))(&local_208,pFVar2,iVar7)
    ;
    poVar5 = std::operator<<(local_1a8,(string *)&local_208);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_208);
  }
  if ((this->outer_argument)._M_t.
      super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl !=
      (FunctionCallArgument *)0x0) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_228,(char)iVar7);
    std::operator+(&local_208,&local_228,"OuterArgument-> ");
    poVar5 = std::operator<<(local_1a8,(string *)&local_208);
    pFVar2 = (this->outer_argument)._M_t.
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl;
    (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x18))(local_1d8,pFVar2,iVar7);
    poVar5 = std::operator<<(poVar5,local_1d8);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_228,(char)lVar3);
  std::operator+(&local_208,&local_228,"}");
  poVar5 = std::operator<<(local_1a8,(string *)&local_208);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return psVar4;
}

Assistant:

std::string ninx::parser::element::FunctionCall::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "FunctionCall " << this->name << " {" << std::endl;
    if (this->late_call){
        s << std::string(level+1, '\t') + "LATE CALL" << std::endl;
    }
    for (auto& argument : arguments) {
        s << argument->dump(level+1) << std::endl;
    }
    if (this->outer_argument) {
        s << std::string(level+1, '\t') + "OuterArgument-> " << this->outer_argument->dump(level+1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}